

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::isConsistent(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  return true;
}

Assistant:

bool SPxWeightST<R>::isConsistent() const
{
#ifdef ENABLE_CONSISTENCY_CHECKS
   return rowWeight.isConsistent()
          && colWeight.isConsistent()
          && rowRight.isConsistent()
          && colUp.isConsistent();
   // && SPxStarter::isConsistent();   // not yet implemented
#else
   return true;
#endif
}